

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O1

void arena_bin_lower_slab(tsdn_t *tsdn,arena_t *arena,extent_t *slab,bin_t *bin)

{
  bitmap_t *pbVar1;
  long *plVar2;
  extent_t *phn;
  void *pvVar3;
  void *pvVar4;
  extent_t *peVar5;
  extent_t *peVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  phn = (extent_t *)(slab->field_5).e_slab_data.bitmap[6];
  if (phn != (extent_t *)0x0) {
    uVar9 = phn->e_bits >> 0x2a;
    uVar10 = *(ulong *)arena->nthreads >> 0x2a;
    iVar8 = (uint)(uVar10 < uVar9) - (uint)(uVar9 < uVar10);
    if (iVar8 == 0) {
      pvVar3 = phn->e_addr;
      pvVar4 = *(void **)&arena->binshard_next;
      iVar8 = (uint)(pvVar3 >= pvVar4 && pvVar3 != pvVar4) - (uint)(pvVar3 < pvVar4);
    }
    if (0 < iVar8) {
      if ((phn->e_bits & 0xffc000000) == 0) {
        if (manual_arena_base <=
            **(uint **)(tsdn[4].tsd.cant_access_tsd_items_directly_use_a_getter_or_setter_tcache.
                        bins_large + 0x82)) {
          peVar5 = (extent_t *)slab[1].e_bits;
          if (peVar5 != (extent_t *)0x0) {
            peVar6 = (peVar5->ql_link).qre_prev;
            (phn->ql_link).qre_prev = peVar6;
            (phn->ql_link).qre_next = peVar5;
            (peVar6->ql_link).qre_next = phn;
            (peVar5->ql_link).qre_prev = phn;
          }
          slab[1].e_bits = (uint64_t)(phn->ql_link).qre_next;
        }
      }
      else {
        extent_heap_insert((extent_heap_t *)((slab->field_5).e_slab_data.bitmap + 7),phn);
        pbVar1 = slab[1].field_5.e_slab_data.bitmap + 2;
        *pbVar1 = *pbVar1 + 1;
      }
      (slab->field_5).e_slab_data.bitmap[6] = (bitmap_t)arena;
      lVar7 = 0xc0;
      goto LAB_00119acb;
    }
  }
  extent_heap_insert((extent_heap_t *)((slab->field_5).e_slab_data.bitmap + 7),(extent_t *)arena);
  lVar7 = 0xd0;
LAB_00119acb:
  plVar2 = (long *)((long)&slab->e_bits + lVar7);
  *plVar2 = *plVar2 + 1;
  return;
}

Assistant:

static void
arena_bin_lower_slab(tsdn_t *tsdn, arena_t *arena, extent_t *slab,
    bin_t *bin) {
	assert(extent_nfree_get(slab) > 0);

	/*
	 * Make sure that if bin->slabcur is non-NULL, it refers to the
	 * oldest/lowest non-full slab.  It is okay to NULL slabcur out rather
	 * than proactively keeping it pointing at the oldest/lowest non-full
	 * slab.
	 */
	if (bin->slabcur != NULL && extent_snad_comp(bin->slabcur, slab) > 0) {
		/* Switch slabcur. */
		if (extent_nfree_get(bin->slabcur) > 0) {
			arena_bin_slabs_nonfull_insert(bin, bin->slabcur);
		} else {
			arena_bin_slabs_full_insert(arena, bin, bin->slabcur);
		}
		bin->slabcur = slab;
		if (config_stats) {
			bin->stats.reslabs++;
		}
	} else {
		arena_bin_slabs_nonfull_insert(bin, slab);
	}
}